

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<const_kj::String>::operator==
          (ArrayPtr<const_kj::String> *this,ArrayPtr<const_kj::String> *other)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  StringPtr local_40;
  
  if (this->size_ == other->size_) {
    uVar4 = 0xffffffffffffffff;
    lVar3 = 0;
    do {
      uVar4 = uVar4 + 1;
      bVar5 = this->size_ <= uVar4;
      if (bVar5) {
        return bVar5;
      }
      lVar1 = *(long *)((long)&(other->ptr->content).size_ + lVar3);
      local_40.content.ptr = "";
      if (lVar1 != 0) {
        local_40.content.ptr = *(char **)((long)&(other->ptr->content).ptr + lVar3);
      }
      local_40.content.size_ = lVar1 + (ulong)(lVar1 == 0);
      bVar2 = String::operator!=((String *)((long)&(this->ptr->content).ptr + lVar3),&local_40);
      lVar3 = lVar3 + 0x18;
    } while (!bVar2);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

inline bool operator==(const ArrayPtr& other) const {
    if (size_ != other.size_) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }